

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

map_iterator map_iterator_begin(map m)

{
  size_t sVar1;
  map in_RDI;
  map_iterator it;
  map_iterator local_8;
  
  if ((((in_RDI == (map)0x0) || (in_RDI->buckets == (bucket)0x0)) ||
      (sVar1 = map_size(in_RDI), sVar1 == 0)) ||
     (local_8 = (map_iterator)malloc(0x18), local_8 == (map_iterator)0x0)) {
    local_8 = (map_iterator)0x0;
  }
  else {
    local_8->m = in_RDI;
    local_8->current_bucket = 0;
    local_8->current_pair = 0;
    map_iterator_next(local_8);
  }
  return local_8;
}

Assistant:

map_iterator map_iterator_begin(map m)
{
	if (m != NULL && m->buckets != NULL && map_size(m) > 0)
	{
		map_iterator it = malloc(sizeof(struct map_iterator_type));

		if (it != NULL)
		{
			it->m = m;
			it->current_bucket = 0;
			it->current_pair = 0;

			map_iterator_next(it);

			return it;
		}
	}

	return NULL;
}